

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::BlockReferencedByShaderValidator::
getHumanReadablePropertyString_abi_cxx11_(string *__return_storage_ptr__,void *this,GLint propVal)

{
  Enum<int,_2UL> EVar1;
  GetNameFunc local_30;
  int local_28;
  GLint local_1c;
  void *pvStack_18;
  GLint propVal_local;
  BlockReferencedByShaderValidator *this_local;
  
  local_1c = propVal;
  pvStack_18 = this;
  this_local = (BlockReferencedByShaderValidator *)__return_storage_ptr__;
  EVar1 = glu::getBooleanStr(propVal);
  local_30 = EVar1.m_getName;
  local_28 = EVar1.m_value;
  de::toString<tcu::Format::Enum<int,2ul>>(__return_storage_ptr__,(de *)&local_30,EVar1._8_8_);
  return __return_storage_ptr__;
}

Assistant:

std::string BlockReferencedByShaderValidator::getHumanReadablePropertyString (glw::GLint propVal) const
{
	return de::toString(glu::getBooleanStr(propVal));
}